

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mac_legacy_kmgmt.c
# Opt level: O0

int mac_match(void *keydata1,void *keydata2,int selection)

{
  int iVar1;
  uint in_EDX;
  long in_RSI;
  long in_RDI;
  int ok;
  MAC_KEY *key2;
  MAC_KEY *key1;
  EVP_CIPHER *in_stack_ffffffffffffffb8;
  bool local_37;
  bool local_36;
  uint local_34;
  uint local_4;
  
  local_34 = 1;
  iVar1 = ossl_prov_is_running();
  if (iVar1 == 0) {
    local_4 = 0;
  }
  else {
    if ((in_EDX & 1) != 0) {
      if (((((*(long *)(in_RDI + 0x18) == 0) && (*(long *)(in_RSI + 0x18) != 0)) ||
           ((*(long *)(in_RDI + 0x18) != 0 && (*(long *)(in_RSI + 0x18) == 0)))) ||
          (*(long *)(in_RDI + 0x20) != *(long *)(in_RSI + 0x20))) ||
         (((*(long *)(in_RDI + 0x28) == 0 && (*(long *)(in_RSI + 0x28) != 0)) ||
          ((*(long *)(in_RDI + 0x28) != 0 && (*(long *)(in_RSI + 0x28) == 0)))))) {
        local_34 = 0;
      }
      else {
        local_36 = true;
        if (*(long *)(in_RDI + 0x18) != 0) {
          iVar1 = CRYPTO_memcmp(*(void **)(in_RDI + 0x18),*(void **)(in_RSI + 0x18),
                                *(size_t *)(in_RDI + 0x20));
          local_36 = iVar1 == 0;
        }
        local_34 = (uint)local_36;
      }
      if (*(long *)(in_RDI + 0x28) != 0) {
        local_37 = false;
        if (local_34 != 0) {
          EVP_CIPHER_get0_name(in_stack_ffffffffffffffb8);
          iVar1 = EVP_CIPHER_is_a(in_stack_ffffffffffffffb8,(char *)0x337ff3);
          local_37 = iVar1 != 0;
        }
        local_34 = (uint)local_37;
      }
    }
    local_4 = local_34;
  }
  return local_4;
}

Assistant:

static int mac_match(const void *keydata1, const void *keydata2, int selection)
{
    const MAC_KEY *key1 = keydata1;
    const MAC_KEY *key2 = keydata2;
    int ok = 1;

    if (!ossl_prov_is_running())
        return 0;

    if ((selection & OSSL_KEYMGMT_SELECT_PRIVATE_KEY) != 0) {
        if ((key1->priv_key == NULL && key2->priv_key != NULL)
                || (key1->priv_key != NULL && key2->priv_key == NULL)
                || key1->priv_key_len != key2->priv_key_len
                || (key1->cipher.cipher == NULL && key2->cipher.cipher != NULL)
                || (key1->cipher.cipher != NULL && key2->cipher.cipher == NULL))
            ok = 0;
        else
            ok = ok && (key1->priv_key == NULL /* implies key2->privkey == NULL */
                        || CRYPTO_memcmp(key1->priv_key, key2->priv_key,
                                         key1->priv_key_len) == 0);
        if (key1->cipher.cipher != NULL)
            ok = ok && EVP_CIPHER_is_a(key1->cipher.cipher,
                                       EVP_CIPHER_get0_name(key2->cipher.cipher));
    }
    return ok;
}